

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenGEXImporter.cpp
# Opt level: O1

void __thiscall
Assimp::OpenGEX::OpenGEXImporter::handleMaterialRefNode
          (OpenGEXImporter *this,DDLNode *node,aiScene *param_2)

{
  _Head_base<0UL,_Assimp::OpenGEX::OpenGEXImporter::RefInfo_*,_false> _Var1;
  RefInfo *pRVar2;
  runtime_error *this_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  matRefNames;
  _Head_base<0UL,_Assimp::OpenGEX::OpenGEXImporter::RefInfo_*,_false> local_50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  if (this->m_currentNode != (aiNode *)0x0) {
    local_48.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_48.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    getRefNames(node,&local_48);
    if (local_48.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_48.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pRVar2 = (RefInfo *)operator_new(0x28);
      pRVar2->m_node = this->m_currentNode;
      pRVar2->m_type = MaterialRef;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&pRVar2->m_Names,&local_48);
      local_50._M_head_impl = pRVar2;
      std::
      vector<std::unique_ptr<Assimp::OpenGEX::OpenGEXImporter::RefInfo,std::default_delete<Assimp::OpenGEX::OpenGEXImporter::RefInfo>>,std::allocator<std::unique_ptr<Assimp::OpenGEX::OpenGEXImporter::RefInfo,std::default_delete<Assimp::OpenGEX::OpenGEXImporter::RefInfo>>>>
      ::
      emplace_back<std::unique_ptr<Assimp::OpenGEX::OpenGEXImporter::RefInfo,std::default_delete<Assimp::OpenGEX::OpenGEXImporter::RefInfo>>>
                ((vector<std::unique_ptr<Assimp::OpenGEX::OpenGEXImporter::RefInfo,std::default_delete<Assimp::OpenGEX::OpenGEXImporter::RefInfo>>,std::allocator<std::unique_ptr<Assimp::OpenGEX::OpenGEXImporter::RefInfo,std::default_delete<Assimp::OpenGEX::OpenGEXImporter::RefInfo>>>>
                  *)&this->m_unresolvedRefStack,
                 (unique_ptr<Assimp::OpenGEX::OpenGEXImporter::RefInfo,_std::default_delete<Assimp::OpenGEX::OpenGEXImporter::RefInfo>_>
                  *)&local_50);
      _Var1._M_head_impl = local_50._M_head_impl;
      if (local_50._M_head_impl != (RefInfo *)0x0) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&(local_50._M_head_impl)->m_Names);
        operator_delete(_Var1._M_head_impl);
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_48);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)&local_48.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"No parent node for name.","")
  ;
  std::runtime_error::runtime_error(this_00,(string *)&local_48);
  *(undefined ***)this_00 = &PTR__runtime_error_0081d260;
  __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void OpenGEXImporter::handleMaterialRefNode( ODDLParser::DDLNode *node, aiScene * /*pScene*/ ) {
    if( nullptr == m_currentNode ) {
        throw DeadlyImportError( "No parent node for name." );
        return;
    }

    std::vector<std::string> matRefNames;
    getRefNames( node, matRefNames );
    if( !matRefNames.empty() ) {
        m_unresolvedRefStack.push_back( std::unique_ptr<RefInfo>( new RefInfo( m_currentNode, RefInfo::MaterialRef, matRefNames ) ) );
    }
}